

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BenchmarkSuite.hpp
# Opt level: O3

void benchmarks::detail::
     BenchmarksClassRegistrar<benchmarks::MutexBenchmarks,_descriptors::mutex::std::Mutex,_descriptors::mutex::std::RecursiveMutex,_descriptors::mutex::boost::Mutex,_descriptors::mutex::boost::RecursiveMutex>
     ::Register(BenchmarksMap *benchmarks)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  pointer psVar3;
  MutexBenchmarks<descriptors::mutex::std::Mutex> bm;
  undefined4 uStack_18c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_180;
  size_type local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_160;
  size_type local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_140;
  undefined8 local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_120;
  undefined8 local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  ulong *local_100;
  undefined8 local_f8;
  ulong local_f0 [2];
  pointer local_e0;
  pair<const_benchmarks::BenchmarkId,_std::shared_ptr<benchmarks::IBenchmark>_> local_d8;
  MutexBenchmarks<descriptors::mutex::std::Mutex> local_68;
  
  MutexBenchmarks<descriptors::mutex::std::Mutex>::MutexBenchmarks(&local_68);
  local_e0 = local_68.super_BenchmarksClass._benchmarks.
             super__Vector_base<std::shared_ptr<benchmarks::IBenchmark>,_std::allocator<std::shared_ptr<benchmarks::IBenchmark>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_68.super_BenchmarksClass._benchmarks.
      super__Vector_base<std::shared_ptr<benchmarks::IBenchmark>,_std::allocator<std::shared_ptr<benchmarks::IBenchmark>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_68.super_BenchmarksClass._benchmarks.
      super__Vector_base<std::shared_ptr<benchmarks::IBenchmark>,_std::allocator<std::shared_ptr<benchmarks::IBenchmark>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    paVar1 = &local_d8.first._className.field_2;
    psVar3 = local_68.super_BenchmarksClass._benchmarks.
             super__Vector_base<std::shared_ptr<benchmarks::IBenchmark>,_std::allocator<std::shared_ptr<benchmarks::IBenchmark>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      peVar2 = (psVar3->super___shared_ptr<benchmarks::IBenchmark,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      this = (psVar3->super___shared_ptr<benchmarks::IBenchmark,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this->_M_use_count = this->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this->_M_use_count = this->_M_use_count + 1;
        }
      }
      local_160 = &local_150;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_160,local_68.super_BenchmarksClass._name._M_dataplus._M_p,
                 local_68.super_BenchmarksClass._name._M_dataplus._M_p +
                 local_68.super_BenchmarksClass._name._M_string_length);
      (*peVar2->_vptr_IBenchmark[2])(&local_180,peVar2);
      local_d8.first._className._M_string_length = local_158;
      local_d8.first._benchmarkName._M_string_length = local_178;
      if (local_160 == &local_150) {
        local_160 = &local_130;
        local_130._8_8_ = local_150._8_8_;
      }
      local_130._M_allocated_capacity._1_7_ = local_150._M_allocated_capacity._1_7_;
      local_130._M_local_buf[0] = local_150._M_local_buf[0];
      local_158 = 0;
      local_150._M_local_buf[0] = '\0';
      if (local_180 == &local_170) {
        local_180 = &local_110;
        local_110._8_8_ = local_170._8_8_;
      }
      local_110._M_allocated_capacity._1_7_ = local_170._M_allocated_capacity._1_7_;
      local_110._M_local_buf[0] = local_170._M_local_buf[0];
      local_178 = 0;
      local_170._M_local_buf[0] = '\0';
      local_d8.first._objectName.field_2._M_allocated_capacity = CONCAT44(uStack_18c,0x647473);
      local_140 = &local_130;
      local_d8.first._className._M_dataplus._M_p = (pointer)local_160;
      if (local_160 == local_140) {
        local_d8.first._className.field_2._8_8_ = local_130._8_8_;
        local_d8.first._className._M_dataplus._M_p = (pointer)paVar1;
      }
      local_d8.first._className.field_2._M_allocated_capacity = local_130._M_allocated_capacity;
      local_138 = 0;
      local_130._M_allocated_capacity = (ulong)(uint7)local_150._M_allocated_capacity._1_7_ << 8;
      local_120 = &local_110;
      local_d8.first._benchmarkName._M_dataplus._M_p = (pointer)local_180;
      if (local_180 == local_120) {
        local_d8.first._benchmarkName.field_2._8_8_ = local_110._8_8_;
        local_d8.first._benchmarkName._M_dataplus._M_p =
             (pointer)&local_d8.first._benchmarkName.field_2;
      }
      local_d8.first._benchmarkName.field_2._M_allocated_capacity = local_110._M_allocated_capacity;
      local_118 = 0;
      local_110._M_allocated_capacity = (ulong)(uint7)local_170._M_allocated_capacity._1_7_ << 8;
      local_d8.first._objectName._M_dataplus._M_p = (pointer)&local_d8.first._objectName.field_2;
      local_100 = local_f0;
      local_d8.first._objectName._M_string_length = 3;
      local_f8 = 0;
      local_f0[0] = local_d8.first._objectName.field_2._M_allocated_capacity & 0xffffffffffffff00;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this->_M_use_count = this->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this->_M_use_count = this->_M_use_count + 1;
        }
      }
      local_180 = &local_170;
      local_160 = &local_150;
      local_d8.second.super___shared_ptr<benchmarks::IBenchmark,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = peVar2;
      local_d8.second.super___shared_ptr<benchmarks::IBenchmark,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = this;
      std::
      _Rb_tree<benchmarks::BenchmarkId,std::pair<benchmarks::BenchmarkId_const,std::shared_ptr<benchmarks::IBenchmark>>,std::_Select1st<std::pair<benchmarks::BenchmarkId_const,std::shared_ptr<benchmarks::IBenchmark>>>,std::less<benchmarks::BenchmarkId>,std::allocator<std::pair<benchmarks::BenchmarkId_const,std::shared_ptr<benchmarks::IBenchmark>>>>
      ::
      _M_insert_unique<std::pair<benchmarks::BenchmarkId_const,std::shared_ptr<benchmarks::IBenchmark>>>
                ((_Rb_tree<benchmarks::BenchmarkId,std::pair<benchmarks::BenchmarkId_const,std::shared_ptr<benchmarks::IBenchmark>>,std::_Select1st<std::pair<benchmarks::BenchmarkId_const,std::shared_ptr<benchmarks::IBenchmark>>>,std::less<benchmarks::BenchmarkId>,std::allocator<std::pair<benchmarks::BenchmarkId_const,std::shared_ptr<benchmarks::IBenchmark>>>>
                  *)benchmarks,&local_d8);
      if (local_d8.second.super___shared_ptr<benchmarks::IBenchmark,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_d8.second.
                   super___shared_ptr<benchmarks::IBenchmark,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8.first._objectName._M_dataplus._M_p != &local_d8.first._objectName.field_2) {
        operator_delete(local_d8.first._objectName._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8.first._benchmarkName._M_dataplus._M_p !=
          &local_d8.first._benchmarkName.field_2) {
        operator_delete(local_d8.first._benchmarkName._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8.first._className._M_dataplus._M_p != paVar1) {
        operator_delete(local_d8.first._className._M_dataplus._M_p);
      }
      if (local_100 != local_f0) {
        operator_delete(local_100);
      }
      if (local_120 != &local_110) {
        operator_delete(local_120);
      }
      if (local_140 != &local_130) {
        operator_delete(local_140);
      }
      if (local_180 != &local_170) {
        operator_delete(local_180);
      }
      if (local_160 != &local_150) {
        operator_delete(local_160);
      }
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      psVar3 = psVar3 + 1;
    } while (psVar3 != local_e0);
  }
  BenchmarksClassRegistrar<benchmarks::MutexBenchmarks,_descriptors::mutex::std::RecursiveMutex,_descriptors::mutex::boost::Mutex,_descriptors::mutex::boost::RecursiveMutex>
  ::Register(benchmarks);
  std::
  vector<std::shared_ptr<benchmarks::IBenchmark>,_std::allocator<std::shared_ptr<benchmarks::IBenchmark>_>_>
  ::~vector(&local_68.super_BenchmarksClass._benchmarks);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.super_BenchmarksClass._name._M_dataplus._M_p !=
      &local_68.super_BenchmarksClass._name.field_2) {
    operator_delete(local_68.super_BenchmarksClass._name._M_dataplus._M_p);
  }
  return;
}

Assistant:

static void Register(BenchmarksMap& benchmarks)
			{
				BenchmarksClass_<ObjectsDescHead_> bm;
				for (auto b : bm.GetBenchmarks())
					benchmarks.insert({BenchmarkId(bm.GetName(), b->GetName(), ObjectsDescHead_::GetName()), b});

				BenchmarksClassRegistrar<BenchmarksClass_, ObjectsDescTail_...>::Register(benchmarks);
			}